

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pizza_cutter.cpp
# Opt level: O2

optional<pizza_slice> * __thiscall
pizza_cutter::create_slice_for
          (optional<pizza_slice> *__return_storage_ptr__,pizza_cutter *this,int row,int col)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  pizza_slice *ppVar4;
  undefined4 in_register_00000014;
  ulong uVar5;
  bool bVar6;
  byte bVar7;
  pointer pvVar8;
  long lVar9;
  pizza_slice ps;
  pizza_slice ps_00;
  ulong local_48;
  int local_40;
  int local_3c;
  pointer local_38;
  
  local_48 = CONCAT44(in_register_00000014,row);
  uVar5 = (ulong)(uint)col;
  if (*(int *)(*(long *)&(this->pizza_).
                         super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[row].
                         super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>._M_impl.
                         super__Vector_impl_data + 4 + (long)col * 8) == -1) {
    bVar6 = true;
    pvVar8 = (pointer)CONCAT44(col,row);
    while (bVar6) {
      uVar5 = local_48 & 0xffffffff | uVar5 << 0x20;
      bVar3 = 1;
      bVar7 = 0;
      for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 4) {
        ps._8_8_ = pvVar8;
        ps.row1 = (int)uVar5;
        ps.col1 = (int)(uVar5 >> 0x20);
        extend_slice(__return_storage_ptr__,this,ps,
                     *(direction *)((long)directions._M_elems + lVar9));
        if ((__return_storage_ptr__->super__Optional_base<pizza_slice,_true,_true>)._M_payload.
            super__Optional_payload_base<pizza_slice>._M_engaged == true) {
          ppVar4 = std::optional<pizza_slice>::value(__return_storage_ptr__);
          uVar1 = ppVar4->row1;
          uVar2 = ppVar4->col1;
          ps_00.col2 = uVar2;
          ps_00.row2 = uVar1;
          ps_00._0_8_ = this;
          count_ingredients((pizza_cutter *)&local_40,ps_00);
          if (this->max_total_ < local_40 + local_3c) {
            bVar7 = 1;
          }
          else {
            if (this->min_each_ <= local_3c && this->min_each_ <= local_40) {
              return __return_storage_ptr__;
            }
            ppVar4 = std::optional<pizza_slice>::value(__return_storage_ptr__);
            local_48._0_4_ = ppVar4->row1;
            local_48._4_4_ = ppVar4->col1;
            local_38 = *(pointer *)&ppVar4->row2;
            bVar7 = 1;
            bVar3 = 0;
          }
        }
      }
      uVar5 = local_48 >> 0x20;
      bVar6 = (bool)(bVar7 & (bVar3 ^ 1));
      pvVar8 = local_38;
    }
  }
  (__return_storage_ptr__->super__Optional_base<pizza_slice,_true,_true>)._M_payload.
  super__Optional_payload_base<pizza_slice>._M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

std::optional<pizza_slice> pizza_cutter::create_slice_for(int row, int col) const noexcept
{
    if (pizza_[row][col].owner != -1) return std::nullopt;

    pizza_slice slice{row, col, row, col};

    bool look_for_next = true;
    while (look_for_next) {
        bool could_be_extended = false;
        bool all_is_too_large = true;

        pizza_slice candidate;
        for (auto d : directions) {
            auto new_slice = extend_slice(slice, d);

            if (new_slice) {
                could_be_extended = true;
                auto [mushrooms, tomatoes] = count_ingredients(new_slice.value());

                if (is_too_large(mushrooms, tomatoes))
                    continue;

                all_is_too_large = false;

                if (is_minimum_ingredients(mushrooms, tomatoes))
                    return new_slice;

                candidate = new_slice.value();
            }
        }
        slice = candidate;
        look_for_next = could_be_extended && !all_is_too_large;
    }

    return std::nullopt;
}